

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtDeriveBiDec(word *pTruth,int nVars,int This,int That,int nSuppLim,word *pThis,word *pThat
                      )

{
  int iVar1;
  word wVar2;
  word *pThis_local;
  int nSuppLim_local;
  int That_local;
  int This_local;
  int nVars_local;
  word *pTruth_local;
  
  iVar1 = Abc_TtBitCount16(This);
  if (nSuppLim < iVar1) {
    __assert_fail("Abc_TtBitCount16(This) <= nSuppLim",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                  ,0x9b8,"void Abc_TtDeriveBiDec(word *, int, int, int, int, word *, word *)");
  }
  iVar1 = Abc_TtBitCount16(That);
  if (iVar1 <= nSuppLim) {
    wVar2 = Abc_TtDeriveBiDecOne(pTruth,nVars,This);
    *pThis = wVar2;
    wVar2 = Abc_TtDeriveBiDecOne(pTruth,nVars,That);
    *pThat = wVar2;
    iVar1 = Abc_TtVerifyBiDec(pTruth,nVars,This,That,nSuppLim,*pThis,*pThat);
    if (iVar1 == 0) {
      printf("Bi-decomposition verification failed.\n");
    }
    return;
  }
  __assert_fail("Abc_TtBitCount16(That) <= nSuppLim",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                ,0x9b9,"void Abc_TtDeriveBiDec(word *, int, int, int, int, word *, word *)");
}

Assistant:

static inline void Abc_TtDeriveBiDec( word * pTruth, int nVars, int This, int That, int nSuppLim, word * pThis, word * pThat )
{
    assert( Abc_TtBitCount16(This) <= nSuppLim );
    assert( Abc_TtBitCount16(That) <= nSuppLim );
    pThis[0] = Abc_TtDeriveBiDecOne( pTruth, nVars, This );
    pThat[0] = Abc_TtDeriveBiDecOne( pTruth, nVars, That );
    if ( !Abc_TtVerifyBiDec(pTruth, nVars, This, That, nSuppLim, pThis[0], pThat[0] ) )
        printf( "Bi-decomposition verification failed.\n" );
}